

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_functions.h
# Opt level: O3

bool __thiscall sliding_puzzle::SlidingPuzzleState::Compare::operator()(Compare *this,Ptr *a,Ptr *b)

{
  long *plVar1;
  element_type *peVar2;
  long *plVar3;
  long *plVar4;
  pointer pvVar5;
  int iVar6;
  void *pvVar7;
  size_t __n;
  void *__s2;
  void *__s1;
  long lVar8;
  long lVar9;
  
  peVar2 = (a->super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  plVar3 = (long *)(peVar2->state_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  plVar4 = (long *)(((b->
                     super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->state_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  __s1 = (void *)*plVar3;
  pvVar7 = (void *)plVar3[1];
  __n = (long)pvVar7 - (long)__s1;
  __s2 = (void *)*plVar4;
  if (__n == plVar4[1] - (long)__s2) {
    pvVar5 = (peVar2->state_).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar8 = 1;
    lVar9 = 0x20;
    do {
      if ((pvVar7 != __s1) && (iVar6 = bcmp(__s1,__s2,__n), iVar6 != 0)) {
        return false;
      }
      if (((long)pvVar5 - (long)plVar3 >> 3) * -0x5555555555555555 - lVar8 == 0) {
        return true;
      }
      __s1 = *(void **)((long)plVar3 + lVar9 + -8);
      pvVar7 = *(void **)((long)plVar3 + lVar9);
      __n = (long)pvVar7 - (long)__s1;
      __s2 = *(void **)((long)plVar4 + lVar9 + -8);
      plVar1 = (long *)((long)plVar4 + lVar9);
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x18;
    } while (__n == *plVar1 - (long)__s2);
  }
  return false;
}

Assistant:

bool operator()(const Ptr& a,
                    const Ptr& b) const
    {
      for (int i=0; i<a->state_.size(); ++i)
      {
        if (a->state_[i] != b->state_[i])
        {
          return false;
        }
        if (i == a->state_.size()-1)
        {
          return true;
        }
      }
    }